

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O3

Nodes * __thiscall
crawler::Node::getElementsByTag(Nodes *__return_storage_ptr__,Node *this,string *tagName)

{
  NodeData *this_00;
  size_t __n;
  pointer pNVar1;
  _Elt_pointer pNVar2;
  int iVar3;
  variant_alternative_t<0UL,_variant<ElementData,_basic_string<char>_>_> *pvVar4;
  Node *childrenNode;
  pointer pNVar5;
  queue<crawler::Node,_std::deque<crawler::Node,_std::allocator<crawler::Node>_>_> queue;
  Node root;
  Node tempNode;
  vector<crawler::Node,_std::allocator<crawler::Node>_> local_1b0;
  _Deque_base<crawler::Node,_std::allocator<crawler::Node>_> local_198;
  value_type local_140;
  Node local_b8;
  
  (__return_storage_ptr__->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<crawler::Node,_std::allocator<crawler::Node>_>::_M_initialize_map(&local_198,0);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
            (&local_140.children,&this->children);
  local_140.nodeType = this->nodeType;
  std::__detail::__variant::
  _Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_140.nodeData,
                    (_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&this->nodeData);
  local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  std::deque<crawler::Node,_std::allocator<crawler::Node>_>::push_back
            ((deque<crawler::Node,_std::allocator<crawler::Node>_> *)&local_198,&local_140);
  if (local_198._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_198._M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = &local_b8.nodeData;
    do {
      pNVar2 = local_198._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
                (&local_b8.children,
                 &(local_198._M_impl.super__Deque_impl_data._M_start._M_cur)->children);
      local_b8.nodeType = pNVar2->nodeType;
      std::__detail::__variant::
      _Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00,
                        (_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&pNVar2->nodeData);
      local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pNVar2->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (pNVar2->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::deque<crawler::Node,_std::allocator<crawler::Node>_>::pop_front
                ((deque<crawler::Node,_std::allocator<crawler::Node>_> *)&local_198);
      if (local_b8.nodeType == Element) {
        pvVar4 = std::get<0ul,crawler::ElementData,std::__cxx11::string>(this_00);
        __n = (pvVar4->tagName)._M_string_length;
        if (__n == tagName->_M_string_length) {
          if (__n != 0) {
            iVar3 = bcmp((pvVar4->tagName)._M_dataplus._M_p,(tagName->_M_dataplus)._M_p,__n);
            if (iVar3 != 0) goto LAB_00108935;
          }
          std::vector<crawler::Node,std::allocator<crawler::Node>>::emplace_back<crawler::Node&>
                    ((vector<crawler::Node,std::allocator<crawler::Node>> *)__return_storage_ptr__,
                     &local_b8);
        }
      }
LAB_00108935:
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
                (&local_1b0,&local_b8.children);
      pNVar5 = local_1b0.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pNVar1 = local_1b0.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_1b0);
      if (pNVar1 != pNVar5) {
        std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
                  (&local_1b0,&local_b8.children);
        pNVar1 = local_1b0.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pNVar5 = local_1b0.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start; pNVar5 != pNVar1;
            pNVar5 = pNVar5 + 1) {
          std::deque<crawler::Node,_std::allocator<crawler::Node>_>::push_back
                    ((deque<crawler::Node,_std::allocator<crawler::Node>_> *)&local_198,pNVar5);
        }
        std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_1b0);
      }
      if (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::__detail::__variant::
      _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this_00);
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_b8.children);
    } while (local_198._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_198._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if (local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_140.nodeData);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_140.children);
  std::deque<crawler::Node,_std::allocator<crawler::Node>_>::~deque
            ((deque<crawler::Node,_std::allocator<crawler::Node>_> *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

crawler::Nodes crawler::Node::getElementsByTag(const std::string &tagName) {
  return getElementsByPredicate([&tagName](const Node &node) -> bool {
    return node.getElementData().getTagName() == tagName;
  });
}